

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O1

QString * rawMonthName(QString *__return_storage_ptr__,QCalendarLocale *localeData,
                      char16_t *monthsData,int month,FormatType type)

{
  ulong uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  DataRange range;
  DataRange local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = (DataRange)&DAT_aaaaaaaaaaaaaaaa;
  if (type == NarrowFormat) {
    uVar1 = (ulong)localeData->m_narrowMonth_idx;
    uVar2 = (ulong)localeData->m_narrowMonth_size;
  }
  else if (type == ShortFormat) {
    uVar1 = (ulong)localeData->m_shortMonth_idx;
    uVar2 = (ulong)localeData->m_shortMonth_size;
  }
  else {
    if (type != LongFormat) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
        (__return_storage_ptr__->d).d = (Data *)0x0;
        (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
        (__return_storage_ptr__->d).size = 0;
        return __return_storage_ptr__;
      }
      goto LAB_00314d7d;
    }
    uVar1 = (ulong)localeData->m_longMonth_idx;
    uVar2 = (ulong)localeData->m_longMonth_size;
  }
  local_18 = (DataRange)(uVar2 << 0x20 | uVar1);
  QLocaleData::DataRange::getListEntry
            (__return_storage_ptr__,&local_18,monthsData,(long)(month + -1));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
LAB_00314d7d:
  __stack_chk_fail();
}

Assistant:

static QString rawMonthName(const QCalendarLocale &localeData,
                            const char16_t *monthsData, int month,
                            QLocale::FormatType type)
{
    QLocaleData::DataRange range;
    switch (type) {
    case QLocale::LongFormat:
        range = localeData.longMonth();
        break;
    case QLocale::ShortFormat:
        range = localeData.shortMonth();
        break;
    case QLocale::NarrowFormat:
        range = localeData.narrowMonth();
        break;
    default:
        return QString();
    }
    return range.getListEntry(monthsData, month - 1);
}